

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderMaxPatchVertices.cpp
# Opt level: O0

bool __thiscall
glcts::TessellationShaderMaxPatchVertices::compareResults
          (TessellationShaderMaxPatchVertices *this,char *description,GLint *ref_iv)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  MessageBuilder local_1b8;
  int local_38;
  byte local_31;
  int i;
  bool test_failed;
  GLint *resultInts;
  Functions *gl;
  GLint *ref_iv_local;
  char *description_local;
  TessellationShaderMaxPatchVertices *this_local;
  
  gl = (Functions *)ref_iv;
  ref_iv_local = (GLint *)description;
  description_local = (char *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  resultInts = (GLint *)CONCAT44(extraout_var,iVar1);
  _i = (int *)0x0;
  _i = (int *)(**(code **)(resultInts + 0x340))(0x8c8e,0,0x20,1);
  dVar2 = (**(code **)(resultInts + 0x200))();
  glu::checkError(dVar2,"glMapBufferRange(ints) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x2c9);
  local_31 = 0;
  local_38 = 0;
  do {
    if (3 < local_38) {
LAB_01603f17:
      (**(code **)(resultInts + 0x59c))(0x8c8e);
      dVar2 = (**(code **)(resultInts + 0x200))();
      glu::checkError(dVar2,"glUnmapBuffer() failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                      ,0x2df);
      return (bool)((local_31 ^ 0xff) & 1);
    }
    if (_i[local_38] != *(int *)((long)&gl->activeShaderProgram + (long)local_38 * 4)) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"Fail");
      this_00 = tcu::TestContext::getLog
                          ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1b8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_1b8,(char **)&ref_iv_local);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [25])" captured results ivec4(");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,_i);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,_i + 1);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,_i + 2);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,_i + 3);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2b56371);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(char (*) [46])"are different from the expected values ivec4(");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)gl);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)((long)&gl->activeShaderProgram + 4));
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)&gl->activeTexture);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)((long)&gl->activeTexture + 4));
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2c23dab);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b8);
      local_31 = 1;
      goto LAB_01603f17;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

bool TessellationShaderMaxPatchVertices::compareResults(const char* description, glw::GLint ref_iv[4])
{
	/* Retrieve ES entry/state points. */
	const glw::Functions& gl		 = m_context.getRenderContext().getFunctions();
	const glw::GLint*	 resultInts = DE_NULL;

	resultInts = (const glw::GLint*)gl.mapBufferRange(
		GL_TRANSFORM_FEEDBACK_BUFFER, 0,
		(sizeof(glw::GLint) /* GLfloat size */ * 4 /* components */ * OUTPUT_VERTEX_COUNT), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange(ints) failed");

	bool test_failed = false;

	/* Comparison of ivec4. */
	for (int i = 0; i < 4 /* components */; i++)
	{
		if (resultInts[i] != ref_iv[i])
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

			m_testCtx.getLog() << tcu::TestLog::Message << description << " captured results ivec4(" << resultInts[0]
							   << ", " << resultInts[1] << ", " << resultInts[2] << ", " << resultInts[3] << ") "
							   << "are different from the expected values ivec4(" << ref_iv[0] << ", " << ref_iv[1]
							   << ", " << ref_iv[2] << ", " << ref_iv[3] << ")." << tcu::TestLog::EndMessage;

			test_failed = true;
			break;
		}
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() failed!");

	return !test_failed;
}